

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_writer.h
# Opt level: O2

void __thiscall
cppwinrt::writer_base<cppwinrt::writer>::write_printf<char_const*,char_const*>
          (writer_base<cppwinrt::writer> *this,char *format,char **args,char **args_1)

{
  uint uVar1;
  ulong uStack_b0;
  string_view local_a8;
  char buffer [128];
  
  uVar1 = snprintf(buffer,0x80,format,*args,*args_1);
  if (uVar1 < 0x80) {
    uStack_b0 = (ulong)uVar1;
  }
  else {
    fwrite("\n*** WARNING: writer_base::write_printf -- buffer too small\n",0x3c,1,_stderr);
    uStack_b0 = 0x7f;
  }
  local_a8._M_len = uStack_b0;
  local_a8._M_str = buffer;
  write_impl(this,&local_a8);
  return;
}

Assistant:

void write_printf(char const* format, Args const&... args)
        {
            char buffer[128];
#if defined(_WIN32) || defined(_WIN64)
            size_t const size = sprintf_s(buffer, format, args...);
#else
            size_t size = snprintf(buffer, sizeof(buffer), format, args...);
            if (size > sizeof(buffer) - 1)
            {
                fprintf(stderr, "\n*** WARNING: writer_base::write_printf -- buffer too small\n");
                size = sizeof(buffer) - 1;
            }
#endif
            write(std::string_view{ buffer, size });
        }